

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::MasteringMetadata::Valid(MasteringMetadata *this)

{
  float fVar1;
  float fVar2;
  PrimaryChromaticity *pPVar3;
  
  fVar1 = this->luminance_min_;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    if (fVar1 < 0.0) {
      return false;
    }
    if (999.99 < fVar1) {
      return false;
    }
    if (this->luminance_max_ <= fVar1 && fVar1 != this->luminance_max_) {
      return false;
    }
  }
  fVar2 = this->luminance_max_;
  if ((fVar2 != 3.4028235e+38) || (NAN(fVar2))) {
    if (fVar2 < fVar1) {
      return false;
    }
    if (fVar2 < 0.0) {
      return false;
    }
    if (9999.99 < fVar2) {
      return false;
    }
  }
  pPVar3 = this->r_;
  if (pPVar3 != (PrimaryChromaticity *)0x0) {
    if (pPVar3->x_ < 0.0) {
      return false;
    }
    if (1.0 < pPVar3->x_) {
      return false;
    }
    if (pPVar3->y_ < 0.0) {
      return false;
    }
    if (1.0 < pPVar3->y_) {
      return false;
    }
  }
  pPVar3 = this->g_;
  if (pPVar3 != (PrimaryChromaticity *)0x0) {
    if (pPVar3->x_ < 0.0) {
      return false;
    }
    if (1.0 < pPVar3->x_) {
      return false;
    }
    if (pPVar3->y_ < 0.0) {
      return false;
    }
    if (1.0 < pPVar3->y_) {
      return false;
    }
  }
  pPVar3 = this->b_;
  if (pPVar3 != (PrimaryChromaticity *)0x0) {
    if (pPVar3->x_ < 0.0) {
      return false;
    }
    if (1.0 < pPVar3->x_) {
      return false;
    }
    if (pPVar3->y_ < 0.0) {
      return false;
    }
    if (1.0 < pPVar3->y_) {
      return false;
    }
  }
  pPVar3 = this->white_point_;
  if (pPVar3 != (PrimaryChromaticity *)0x0) {
    if (pPVar3->x_ < 0.0) {
      return false;
    }
    if (1.0 < pPVar3->x_) {
      return false;
    }
    if (pPVar3->y_ < 0.0) {
      return false;
    }
    if (1.0 < pPVar3->y_) {
      return false;
    }
  }
  return true;
}

Assistant:

bool MasteringMetadata::Valid() const {
  if (luminance_min_ != kValueNotPresent) {
    if (luminance_min_ < kMinLuminance || luminance_min_ > kMinLuminanceMax ||
        luminance_min_ > luminance_max_) {
      return false;
    }
  }
  if (luminance_max_ != kValueNotPresent) {
    if (luminance_max_ < kMinLuminance || luminance_max_ > kMaxLuminanceMax ||
        luminance_max_ < luminance_min_) {
      return false;
    }
  }
  if (r_ && !r_->Valid())
    return false;
  if (g_ && !g_->Valid())
    return false;
  if (b_ && !b_->Valid())
    return false;
  if (white_point_ && !white_point_->Valid())
    return false;

  return true;
}